

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

bool __thiscall cmFindProgramHelper::FileIsExecutableCMP0109(cmFindProgramHelper *this,string *file)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  PolicyID id;
  string local_60;
  string local_40;
  
  if (this->PolicyCMP0109 - NEW < 3) {
    bVar1 = cmsys::SystemTools::FileIsExecutable(file);
    return bVar1;
  }
  if (this->PolicyCMP0109 == OLD) {
    bVar1 = cmsys::SystemTools::FileExists(file,true);
    return bVar1;
  }
  bVar2 = cmsys::SystemTools::FileExists(file,true);
  bVar1 = cmsys::SystemTools::FileIsExecutable(file);
  if (bVar2 != bVar1) {
    this_00 = this->Makefile;
    if (bVar1) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_40,(cmPolicies *)0x6d,id);
      cmStrCat<std::__cxx11::string,char_const(&)[13],std::__cxx11::string_const&,char_const(&)[74]>
                (&local_60,&local_40,(char (*) [13])"\nThe file\n  ",file,
                 (char (*) [74])
                 "\nis executable but not readable.  CMake is ignoring it for compatibility.");
      cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_60);
    }
    else {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_40,(cmPolicies *)0x6d,id);
      cmStrCat<std::__cxx11::string,char_const(&)[13],std::__cxx11::string_const&,char_const(&)[71]>
                (&local_60,&local_40,(char (*) [13])"\nThe file\n  ",file,
                 (char (*) [71])
                 "\nis readable but not executable.  CMake is using it for compatibility.");
      cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_60);
    }
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    bVar1 = bVar2;
  }
  return bVar1;
}

Assistant:

bool FileIsExecutableCMP0109(std::string const& file) const
  {
    switch (this->PolicyCMP0109) {
      case cmPolicies::OLD:
        return cmSystemTools::FileExists(file, true);
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        return cmSystemTools::FileIsExecutable(file);
      default:
        break;
    }
    bool const isExeOld = cmSystemTools::FileExists(file, true);
    bool const isExeNew = cmSystemTools::FileIsExecutable(file);
    if (isExeNew == isExeOld) {
      return isExeNew;
    }
    if (isExeNew) {
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0109),
                 "\n"
                 "The file\n"
                 "  ",
                 file,
                 "\n"
                 "is executable but not readable.  "
                 "CMake is ignoring it for compatibility."));
    } else {
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0109),
                 "\n"
                 "The file\n"
                 "  ",
                 file,
                 "\n"
                 "is readable but not executable.  "
                 "CMake is using it for compatibility."));
    }
    return isExeOld;
  }